

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue json_parse_value(JSParseState *s)

{
  JSContext *ctx;
  JSAtomStruct *pJVar1;
  int iVar2;
  uint uVar3;
  JSAtom v;
  JSValueUnion JVar4;
  uint32_t idx;
  JSRefCountHeader *p;
  int64_t iVar5;
  ulong uVar6;
  JSValue this_obj;
  JSValue JVar7;
  JSValue JVar8;
  
  ctx = s->ctx;
  iVar2 = (s->token).val;
  if (iVar2 == -0x80) {
    JVar4 = (JSValueUnion)*(JSValueUnion *)&(s->token).u;
    iVar5 = (s->token).u.str.str.tag;
LAB_00128125:
    this_obj.tag = iVar5;
    this_obj.u.ptr = JVar4.ptr;
    uVar6 = (ulong)JVar4.ptr >> 0x20;
    iVar2 = json_next_token(s);
LAB_00128134:
    iVar5 = this_obj.tag;
    if (iVar2 == 0) {
      JVar4.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar6 << 0x20);
      goto LAB_00128153;
    }
  }
  else {
    if (iVar2 == -0x7f) {
      JVar4 = (JSValueUnion)*(JSValueUnion *)&(s->token).u;
      iVar5 = (s->token).u.str.str.tag;
      if (0xfffffff4 < (uint)iVar5) {
        *(int *)JVar4.ptr = *JVar4.ptr + 1;
      }
      goto LAB_00128125;
    }
    if (iVar2 == -0x7d) {
      uVar3 = (s->token).u.ident.atom - 1;
      if (2 < uVar3) {
LAB_001280b1:
        js_parse_error(s,"unexpected token: \'%.*s\'",
                       (ulong)(uint)(*(int *)&s->buf_ptr - (int)(s->token).ptr));
        goto LAB_001280fc;
      }
      this_obj.u._4_4_ = 0;
      this_obj.u.int32 = *(uint *)(&DAT_0017f2f8 + (ulong)uVar3 * 4);
      this_obj.tag = *(int64_t *)(&DAT_0017f2e0 + (ulong)uVar3 * 8);
      iVar2 = json_next_token(s);
      uVar6 = 0;
      goto LAB_00128134;
    }
    if (iVar2 == -0x56) {
      js_parse_error(s,"unexpected end of input");
LAB_001280fc:
      this_obj = (JSValue)(ZEXT816(2) << 0x40);
      uVar6 = 0;
    }
    else if (iVar2 == 0x5b) {
      iVar2 = json_next_token(s);
      if (iVar2 != 0) goto LAB_001280fc;
      this_obj = JS_NewArray(ctx);
      uVar6 = (ulong)this_obj.u.ptr >> 0x20;
      if ((int)this_obj.tag != 6) {
        if ((s->token).val == 0x5d) {
LAB_0012828f:
          iVar2 = 0x5d;
          goto LAB_00128291;
        }
        idx = 0;
        while ((JVar8 = json_parse_value(s), (int)JVar8.tag != 6 &&
               (iVar2 = JS_DefinePropertyValueUint32(ctx,this_obj,idx,JVar8,7), -1 < iVar2))) {
          if ((s->token).val != 0x2c) goto LAB_0012828f;
          iVar2 = json_next_token(s);
          if (iVar2 != 0) break;
          if ((s->ext_json != 0) && ((s->token).val == 0x5d)) goto LAB_0012828f;
          idx = idx + 1;
        }
      }
    }
    else {
      if (iVar2 != 0x7b) goto LAB_001280b1;
      iVar2 = json_next_token(s);
      if (iVar2 != 0) goto LAB_001280fc;
      this_obj = JS_NewObject(ctx);
      uVar6 = (ulong)this_obj.u.ptr >> 0x20;
      if ((int)this_obj.tag != 6) {
        iVar2 = (s->token).val;
        if (iVar2 != 0x7d) {
          do {
            if (iVar2 == -0x7f) {
              v = JS_ValueToAtom(ctx,(s->token).u.str.str);
              if (v == 0) goto LAB_00128138;
            }
            else {
              if ((iVar2 != -0x7d) || (s->ext_json == 0)) {
                js_parse_error(s,"expecting property name");
                goto LAB_00128138;
              }
              v = (s->token).u.ident.atom;
              if (0xd1 < (long)(int)v) {
                pJVar1 = ctx->rt->atom_array[(int)v];
                (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
              }
            }
            iVar2 = json_next_token(s);
            if (((iVar2 != 0) || (iVar2 = json_parse_expect(s,0x3a), iVar2 != 0)) ||
               (JVar8 = json_parse_value(s), (int)JVar8.tag == 6)) {
              JS_FreeAtom(ctx,v);
              goto LAB_00128138;
            }
            iVar2 = JS_DefinePropertyValue(ctx,this_obj,v,JVar8,7);
            JS_FreeAtom(ctx,v);
            if (iVar2 < 0) goto LAB_00128138;
            if ((s->token).val != 0x2c) break;
            iVar2 = json_next_token(s);
            if (iVar2 != 0) goto LAB_00128138;
            iVar2 = (s->token).val;
          } while (iVar2 != 0x7d || s->ext_json == 0);
        }
        iVar2 = 0x7d;
LAB_00128291:
        iVar2 = json_parse_expect(s,iVar2);
        goto LAB_00128134;
      }
    }
  }
LAB_00128138:
  JVar8.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar6 << 0x20);
  JVar8.tag = this_obj.tag;
  JS_FreeValue(ctx,JVar8);
  iVar5 = 6;
  JVar4.float64 = 0.0;
LAB_00128153:
  JVar7.tag = iVar5;
  JVar7.u.float64 = JVar4.float64;
  return JVar7;
}

Assistant:

static JSValue json_parse_value(JSParseState *s)
{
    JSContext *ctx = s->ctx;
    JSValue val = JS_NULL;
    int ret;

    switch(s->token.val) {
    case '{':
        {
            JSValue prop_val;
            JSAtom prop_name;
            
            if (json_next_token(s))
                goto fail;
            val = JS_NewObject(ctx);
            if (JS_IsException(val))
                goto fail;
            if (s->token.val != '}') {
                for(;;) {
                    if (s->token.val == TOK_STRING) {
                        prop_name = JS_ValueToAtom(ctx, s->token.u.str.str);
                        if (prop_name == JS_ATOM_NULL)
                            goto fail;
                    } else if (s->ext_json && s->token.val == TOK_IDENT) {
                        prop_name = JS_DupAtom(ctx, s->token.u.ident.atom);
                    } else {
                        js_parse_error(s, "expecting property name");
                        goto fail;
                    }
                    if (json_next_token(s))
                        goto fail1;
                    if (json_parse_expect(s, ':'))
                        goto fail1;
                    prop_val = json_parse_value(s);
                    if (JS_IsException(prop_val)) {
                    fail1:
                        JS_FreeAtom(ctx, prop_name);
                        goto fail;
                    }
                    ret = JS_DefinePropertyValue(ctx, val, prop_name,
                                                 prop_val, JS_PROP_C_W_E);
                    JS_FreeAtom(ctx, prop_name);
                    if (ret < 0)
                        goto fail;

                    if (s->token.val != ',')
                        break;
                    if (json_next_token(s))
                        goto fail;
                    if (s->ext_json && s->token.val == '}')
                        break;
                }
            }
            if (json_parse_expect(s, '}'))
                goto fail;
        }
        break;
    case '[':
        {
            JSValue el;
            uint32_t idx;

            if (json_next_token(s))
                goto fail;
            val = JS_NewArray(ctx);
            if (JS_IsException(val))
                goto fail;
            if (s->token.val != ']') {
                idx = 0;
                for(;;) {
                    el = json_parse_value(s);
                    if (JS_IsException(el))
                        goto fail;
                    ret = JS_DefinePropertyValueUint32(ctx, val, idx, el, JS_PROP_C_W_E);
                    if (ret < 0)
                        goto fail;
                    if (s->token.val != ',')
                        break;
                    if (json_next_token(s))
                        goto fail;
                    idx++;
                    if (s->ext_json && s->token.val == ']')
                        break;
                }
            }
            if (json_parse_expect(s, ']'))
                goto fail;
        }
        break;
    case TOK_STRING:
        val = JS_DupValue(ctx, s->token.u.str.str);
        if (json_next_token(s))
            goto fail;
        break;
    case TOK_NUMBER:
        val = s->token.u.num.val;
        if (json_next_token(s))
            goto fail;
        break;
    case TOK_IDENT:
        if (s->token.u.ident.atom == JS_ATOM_false ||
            s->token.u.ident.atom == JS_ATOM_true) {
            val = JS_NewBool(ctx, (s->token.u.ident.atom == JS_ATOM_true));
        } else if (s->token.u.ident.atom == JS_ATOM_null) {
            val = JS_NULL;
        } else {
            goto def_token;
        }
        if (json_next_token(s))
            goto fail;
        break;
    default:
    def_token:
        if (s->token.val == TOK_EOF) {
            js_parse_error(s, "unexpected end of input");
        } else {
            js_parse_error(s, "unexpected token: '%.*s'",
                           (int)(s->buf_ptr - s->token.ptr), s->token.ptr);
        }
        goto fail;
    }
    return val;
 fail:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}